

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

SimpleDictionaryEntry<const_Js::DynamicType_*,_void_*> * __thiscall
Memory::
AllocateArray<Memory::HeapAllocator,JsUtil::SimpleDictionaryEntry<Js::DynamicType_const*,void*>,false>
          (Memory *this,HeapAllocator *allocator,offset_in_HeapAllocator_to_subr AllocFunc,
          size_t count)

{
  undefined1 auVar1 [16];
  SimpleDictionaryEntry<const_Js::DynamicType_*,_void_*> *pSVar2;
  size_t byteSize;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = count;
  byteSize = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
    byteSize = SUB168(auVar1 * ZEXT816(0x18),0);
  }
  pSVar2 = (SimpleDictionaryEntry<const_Js::DynamicType_*,_void_*> *)
           new__<Memory::HeapAllocator>
                     (byteSize,(HeapAllocator *)this,(offset_in_HeapAllocator_to_subr)allocator);
  return pSVar2;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}